

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
::value_init<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<>>
          (btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>
           *this,field_type i,allocator_type *alloc,piecewise_construct_t *args,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *args_1,tuple<> *args_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  template_ElementType<3UL> *ptVar3;
  long lVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  
  uVar5 = CONCAT71(in_register_00000031,i) & 0xffffffff;
  GetField<3ul>(this);
  ptVar3 = GetField<3ul>(this);
  lVar4 = uVar5 * 0x18;
  pbVar1 = (args_1->
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           ).
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
           ._M_head_impl;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  ptVar3[uVar5].value.first._M_len = pbVar1->_M_string_length;
  *(pointer *)((long)ptVar3 + lVar4 + 8) = pcVar2;
  *(undefined8 *)((long)ptVar3 + lVar4 + 0x10) = 0;
  return;
}

Assistant:

void value_init(const field_type i, allocator_type *alloc, Args &&...args) {
    next_generation();
    absl::container_internal::SanitizerUnpoisonObject(slot(i));
    params_type::construct(alloc, slot(i), std::forward<Args>(args)...);
  }